

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int nameNsPush(xmlParserCtxtPtr ctxt,xmlChar *value,xmlChar *prefix,xmlChar *URI,int line,int nsNr)

{
  int iVar1;
  int extraout_EAX;
  xmlStartTag *pxVar2;
  xmlChar **ppxVar3;
  uint uVar4;
  uint uVar5;
  
  iVar1 = ctxt->nameMax;
  if (ctxt->nameNr < iVar1) {
    if (ctxt->pushTab == (xmlStartTag *)0x0) {
      pxVar2 = (xmlStartTag *)(*xmlMalloc)((long)iVar1 * 0x18);
      ctxt->pushTab = pxVar2;
      if (pxVar2 == (xmlStartTag *)0x0) goto LAB_001438ae;
    }
LAB_0014385e:
    iVar1 = ctxt->nameNr;
    ctxt->nameTab[iVar1] = value;
    ctxt->name = value;
    pxVar2 = ctxt->pushTab;
    pxVar2[iVar1].prefix = prefix;
    pxVar2[iVar1].URI = URI;
    pxVar2[iVar1].line = line;
    pxVar2[iVar1].nsNr = nsNr;
    ctxt->nameNr = iVar1 + 1;
    return iVar1 + 1;
  }
  if (iVar1 < 1) {
    uVar5 = 10;
  }
  else {
    uVar5 = 0xffffffff;
    if ((iVar1 < 1000000000) &&
       (uVar4 = iVar1 + 1U >> 1, uVar5 = uVar4 + iVar1, (int)(1000000000 - uVar4) < iVar1)) {
      uVar5 = 1000000000;
    }
  }
  if (-1 < (int)uVar5) {
    ppxVar3 = (xmlChar **)(*xmlRealloc)(ctxt->nameTab,(ulong)uVar5 * 8);
    if (ppxVar3 != (xmlChar **)0x0) {
      ctxt->nameTab = ppxVar3;
      pxVar2 = (xmlStartTag *)(*xmlRealloc)(ctxt->pushTab,(ulong)uVar5 * 0x18);
      if (pxVar2 != (xmlStartTag *)0x0) {
        ctxt->pushTab = pxVar2;
        ctxt->nameMax = uVar5;
        goto LAB_0014385e;
      }
    }
  }
LAB_001438ae:
  xmlCtxtErrMemory(ctxt);
  return extraout_EAX;
}

Assistant:

static int
nameNsPush(xmlParserCtxtPtr ctxt, const xmlChar * value,
           const xmlChar *prefix, const xmlChar *URI, int line, int nsNr)
{
    xmlStartTag *tag;

    if (ctxt->nameNr >= ctxt->nameMax) {
        const xmlChar **tmp;
        xmlStartTag *tmp2;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->nameMax,
                                  sizeof(tmp[0]) + sizeof(tmp2[0]),
                                  10, XML_MAX_ITEMS);
        if (newSize < 0)
            goto mem_error;

        tmp = xmlRealloc(ctxt->nameTab, newSize * sizeof(tmp[0]));
        if (tmp == NULL)
	    goto mem_error;
	ctxt->nameTab = tmp;

        tmp2 = xmlRealloc(ctxt->pushTab, newSize * sizeof(tmp2[0]));
        if (tmp2 == NULL)
	    goto mem_error;
	ctxt->pushTab = tmp2;

        ctxt->nameMax = newSize;
    } else if (ctxt->pushTab == NULL) {
        ctxt->pushTab = xmlMalloc(ctxt->nameMax * sizeof(ctxt->pushTab[0]));
        if (ctxt->pushTab == NULL)
            goto mem_error;
    }
    ctxt->nameTab[ctxt->nameNr] = value;
    ctxt->name = value;
    tag = &ctxt->pushTab[ctxt->nameNr];
    tag->prefix = prefix;
    tag->URI = URI;
    tag->line = line;
    tag->nsNr = nsNr;
    return (ctxt->nameNr++);
mem_error:
    xmlErrMemory(ctxt);
    return (-1);
}